

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O2

optional_ptr<duckdb::CatalogEntry,_true> __thiscall
duckdb::Catalog::CreateTable
          (Catalog *this,ClientContext *context,
          unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
          *info)

{
  _Head_base<0UL,_duckdb::CreateTableInfo_*,_false> _Var1;
  Binder *info_00;
  type info_01;
  optional_ptr<duckdb::CatalogEntry,_true> oVar2;
  unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
  bound_info;
  shared_ptr<duckdb::Binder,_true> binder;
  undefined1 local_38 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  Binder::CreateBinder
            ((Binder *)(local_38 + 8),context,(optional_ptr<duckdb::Binder,_true>)0x0,REGULAR_BINDER
            );
  info_00 = shared_ptr<duckdb::Binder,_true>::operator->
                      ((shared_ptr<duckdb::Binder,_true> *)(local_38 + 8));
  _Var1._M_head_impl =
       (info->
       super_unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::CreateTableInfo_*,_std::default_delete<duckdb::CreateTableInfo>_>
       .super__Head_base<0UL,_duckdb::CreateTableInfo_*,_false>._M_head_impl;
  (info->super_unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>_>).
  _M_t.super___uniq_ptr_impl<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::CreateTableInfo_*,_std::default_delete<duckdb::CreateTableInfo>_>.
  super__Head_base<0UL,_duckdb::CreateTableInfo_*,_false>._M_head_impl = (CreateTableInfo *)0x0;
  Binder::BindCreateTableInfo
            ((Binder *)local_38,
             (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
             info_00);
  if (_Var1._M_head_impl != (CreateTableInfo *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_CreateInfo + 8))();
  }
  info_01 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
            ::operator*((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                         *)local_38);
  oVar2 = CreateTable(this,context,info_01);
  ::std::
  unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>::
  ~unique_ptr((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
               *)local_38);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  return (optional_ptr<duckdb::CatalogEntry,_true>)oVar2.ptr;
}

Assistant:

optional_ptr<CatalogEntry> Catalog::CreateTable(ClientContext &context, unique_ptr<CreateTableInfo> info) {
	auto binder = Binder::CreateBinder(context);
	auto bound_info = binder->BindCreateTableInfo(std::move(info));
	return CreateTable(context, *bound_info);
}